

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler(DynamicTypeHandler *this)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  
  if (this->offsetOfInlineSlots != 0x10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd1,"(IsObjectHeaderInlined(GetOffsetOfInlineSlots()))",
                                "IsObjectHeaderInlined(GetOffsetOfInlineSlots())");
    if (!bVar2) goto LAB_00ccb7c3;
    *puVar4 = 0;
  }
  uVar3 = this->inlineSlotCapacity;
  if (uVar3 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd2,
                                "(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity())"
                                ,"GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity()"
                               );
    if (!bVar2) goto LAB_00ccb7c3;
    *puVar4 = 0;
    uVar3 = this->inlineSlotCapacity;
  }
  if (this->slotCapacity != (uint)uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xd3,"(GetInlineSlotCapacity() == GetSlotCapacity())",
                                "GetInlineSlotCapacity() == GetSlotCapacity()");
    if (!bVar2) {
LAB_00ccb7c3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void DynamicTypeHandler::VerifyObjectHeaderInlinedTypeHandler() const
    {
        Assert(IsObjectHeaderInlined(GetOffsetOfInlineSlots()));
        Assert(GetInlineSlotCapacity() >= GetObjectHeaderInlinableSlotCapacity());
        Assert(GetInlineSlotCapacity() == GetSlotCapacity());
    }